

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_remove(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  int32_t iVar2;
  long lVar3;
  long lVar4;
  size_t numBytes;
  String *pSVar5;
  bool *pbVar6;
  String local_220;
  TypeException local_210;
  String local_1e0;
  Value local_1d0;
  Value local_1c0;
  long local_1b0;
  long foundPosB;
  String substr;
  String selfStr;
  RuntimeException local_178;
  long local_148;
  long idx;
  ValueList selfList;
  RuntimeException local_120;
  Value local_f0;
  undefined4 local_dc;
  Value local_d8;
  undefined1 local_c8 [8];
  ValueDict selfMap;
  RuntimeException local_a0;
  String local_70;
  undefined1 local_60 [8];
  Value k;
  String local_40;
  ValueType local_30;
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  self.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"self");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  String::String(&local_70,"k");
  Context::GetVar((Context *)local_60,(String *)context,(LocalOnlyMode)&local_70);
  String::~String(&local_70);
  bVar1 = Value::IsNull((Value *)&stack0xffffffffffffffd0);
  if (bVar1) {
    String::String((String *)&selfMap.isTemp,"argument to \'remove\' must not be null");
    pbVar6 = &selfMap.isTemp;
    RuntimeException::RuntimeException(&local_a0,(String *)pbVar6);
    RuntimeException::raise(&local_a0,(int)pbVar6);
    RuntimeException::~RuntimeException(&local_a0);
    String::~String((String *)&selfMap.isTemp);
  }
  if (local_30 == Map) {
    Value::GetDict((ValueDict *)local_c8,(Value *)&stack0xffffffffffffffd0);
    bVar1 = Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::ContainsKey
                      ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                       local_c8,(Value *)local_60);
    if (bVar1) {
      Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Remove
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                 local_c8,(Value *)local_60,(Value *)0x0);
      Value::Value(&local_d8,(Value *)Value::one);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_d8,true);
      Value::~Value(&local_d8);
    }
    else {
      Value::Value(&local_f0,(Value *)Value::zero);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_f0,true);
      Value::~Value(&local_f0);
    }
    local_dc = 1;
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_c8)
    ;
  }
  else if (local_30 == List) {
    bVar1 = Value::IsNull((Value *)local_60);
    if (bVar1) {
      String::String((String *)&selfList.isTemp,"argument to \'remove\' must not be null");
      pbVar6 = &selfList.isTemp;
      RuntimeException::RuntimeException(&local_120,(String *)pbVar6);
      RuntimeException::raise(&local_120,(int)pbVar6);
      RuntimeException::~RuntimeException(&local_120);
      String::~String((String *)&selfList.isTemp);
    }
    Value::GetList((Value *)&idx);
    iVar2 = Value::IntValue((Value *)local_60);
    local_148 = (long)iVar2;
    if (local_148 < 0) {
      lVar3 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&idx);
      local_148 = lVar3 + local_148;
    }
    lVar3 = local_148;
    lVar4 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&idx);
    CheckRange(lVar3,0,lVar4 + -1);
    List<MiniScript::Value>::RemoveAt((List<MiniScript::Value> *)&idx,local_148);
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
    local_dc = 1;
    List<MiniScript::Value>::~List((List<MiniScript::Value> *)&idx);
  }
  else if (local_30 == String) {
    bVar1 = Value::IsNull((Value *)local_60);
    if (bVar1) {
      String::String((String *)&selfStr.isTemp,"argument to \'remove\' must not be null");
      pbVar6 = &selfStr.isTemp;
      RuntimeException::RuntimeException(&local_178,(String *)pbVar6);
      RuntimeException::raise(&local_178,(int)pbVar6);
      RuntimeException::~RuntimeException(&local_178);
      String::~String((String *)&selfStr.isTemp);
    }
    Value::GetString((Value *)&substr.isTemp);
    Value::ToString((Value *)&foundPosB,(Machine *)local_60);
    lVar3 = String::IndexOfB((String *)&substr.isTemp,(String *)&foundPosB,0);
    local_1b0 = lVar3;
    if (lVar3 < 0) {
      Value::Value(&local_1c0,(Value *)&stack0xffffffffffffffd0);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_1c0,true);
      Value::~Value(&local_1c0);
    }
    else {
      numBytes = String::LengthB((String *)&foundPosB);
      String::String(&local_1e0);
      pSVar5 = String::ReplaceB((String *)&substr.isTemp,lVar3,numBytes,&local_1e0);
      Value::Value(&local_1d0,pSVar5);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_1d0,true);
      Value::~Value(&local_1d0);
      String::~String(&local_1e0);
    }
    local_dc = 1;
    String::~String((String *)&foundPosB);
    String::~String((String *)&substr.isTemp);
  }
  else {
    String::String(&local_220,"Type Error: \'remove\' requires map, list, or string");
    pSVar5 = &local_220;
    TypeException::TypeException(&local_210,pSVar5);
    TypeException::raise(&local_210,(int)pSVar5);
    TypeException::~TypeException(&local_210);
    String::~String(&local_220);
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
    local_dc = 1;
  }
  Value::~Value((Value *)local_60);
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value k = context->GetVar("k");
		if (self.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
		if (self.type == ValueType::Map) {
			ValueDict selfMap = self.GetDict();
			if (selfMap.ContainsKey(k)) {
				selfMap.Remove(k);
				return IntrinsicResult(Value::one);
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::List) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			ValueList selfList = self.GetList();
			long idx = k.IntValue();
			if (idx < 0) idx += selfList.Count();
			CheckRange(idx, 0, selfList.Count()-1);
			selfList.RemoveAt(idx);
			return IntrinsicResult::Null;
		} else if (self.type == ValueType::String) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			String selfStr = self.GetString();
			String substr = k.ToString();
			long foundPosB = selfStr.IndexOfB(substr);
			if (foundPosB < 0) return IntrinsicResult(self);
			return IntrinsicResult(selfStr.ReplaceB(foundPosB, substr.LengthB(), String()));
		}
		TypeException("Type Error: 'remove' requires map, list, or string").raise();
		return IntrinsicResult::Null;
	}